

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catalog.hpp
# Opt level: O3

optional_ptr<duckdb::AggregateFunctionCatalogEntry,_true> __thiscall
duckdb::Catalog::GetEntry<duckdb::AggregateFunctionCatalogEntry>
          (Catalog *this,ClientContext *context,string *schema_name,string *name,
          OnEntryNotFound if_not_found,QueryErrorContext error_context)

{
  pointer pcVar1;
  CatalogException *this_00;
  optional_ptr<duckdb::CatalogEntry,_true> entry;
  EntryLookupInfo lookup_info;
  optional_ptr<duckdb::CatalogEntry,_true> local_a0;
  optional_idx local_98;
  string local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  EntryLookupInfo local_50;
  
  local_98 = error_context.query_location.index;
  EntryLookupInfo::EntryLookupInfo(&local_50,AGGREGATE_FUNCTION_ENTRY,name,error_context);
  local_a0 = GetEntry(this,context,schema_name,&local_50,if_not_found);
  if (local_a0.ptr == (CatalogEntry *)0x0) {
    local_a0.ptr = (CatalogEntry *)0x0;
  }
  else {
    optional_ptr<duckdb::CatalogEntry,_true>::CheckValid(&local_a0);
    if ((local_a0.ptr)->type != AGGREGATE_FUNCTION_ENTRY) {
      this_00 = (CatalogException *)__cxa_allocate_exception(0x10);
      local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"%s is not an %s","");
      local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
      pcVar1 = (name->_M_dataplus)._M_p;
      ::std::__cxx11::string::_M_construct<char*>
                ((string *)&local_70,pcVar1,pcVar1 + name->_M_string_length);
      CatalogException::CatalogException<std::__cxx11::string,char_const*>
                (this_00,(QueryErrorContext)local_98.index,&local_90,&local_70,"aggregate function")
      ;
      __cxa_throw(this_00,&CatalogException::typeinfo,::std::runtime_error::~runtime_error);
    }
    optional_ptr<duckdb::CatalogEntry,_true>::CheckValid(&local_a0);
  }
  return (optional_ptr<duckdb::AggregateFunctionCatalogEntry,_true>)local_a0.ptr;
}

Assistant:

optional_ptr<T> GetEntry(ClientContext &context, const string &schema_name, const string &name,
	                         OnEntryNotFound if_not_found, QueryErrorContext error_context = QueryErrorContext()) {
		EntryLookupInfo lookup_info(T::Type, name, error_context);
		auto entry = GetEntry(context, schema_name, lookup_info, if_not_found);
		if (!entry) {
			return nullptr;
		}
		if (entry->type != T::Type) {
			throw CatalogException(error_context, "%s is not an %s", name, T::Name);
		}
		return &entry->template Cast<T>();
	}